

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__jpeg_get_bits(stbi__jpeg *j,int n)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  
  iVar4 = j->code_bits;
  if (iVar4 < n) {
    stbi__grow_buffer_unsafe(j);
    iVar4 = j->code_bits;
  }
  uVar3 = 0;
  if (n <= iVar4) {
    bVar2 = (byte)n & 0x1f;
    uVar3 = j->code_buffer << bVar2 | j->code_buffer >> 0x20 - bVar2;
    uVar1 = stbi__bmask[(uint)n];
    j->code_buffer = ~uVar1 & uVar3;
    uVar3 = uVar3 & uVar1;
    j->code_bits = iVar4 - n;
  }
  return uVar3;
}

Assistant:

stbi_inline static int stbi__jpeg_get_bits(stbi__jpeg *j, int n)
{
   unsigned int k;
   if (j->code_bits < n) stbi__grow_buffer_unsafe(j);
   if (j->code_bits < n) return 0; // ran out of bits from stream, return 0s intead of continuing
   k = stbi_lrot(j->code_buffer, n);
   j->code_buffer = k & ~stbi__bmask[n];
   k &= stbi__bmask[n];
   j->code_bits -= n;
   return k;
}